

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::BackSubstituteAboveDiagonal(Codec *this)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong *puVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint *in_RDI;
  uint8_t *dest_6;
  uint8_t *dest_5;
  uint8_t code_value_5;
  uint heavy_col_i_4;
  uint heavy_row_i_5;
  uint16_t up_row_i;
  uint ge_up_i;
  uint64_t *ge_row_4;
  uint8_t code_value_4;
  uint heavy_col_i_3;
  uint heavy_row_i_4;
  uint16_t ge_row_i_2;
  uint8_t *src_4;
  uint64_t ge_mask;
  uint8_t *dest_4;
  uint win_bits_1;
  uint64_t *ge_row_3;
  uint ge_row_k_2;
  uint16_t above_pivot_i_1;
  uint shift1;
  uint8_t *dest_3;
  uint32_t win_bits;
  uint64_t *ge_row_2;
  uint ge_row_k_1;
  uint16_t above_pivot_i;
  uint16_t *pivot_row;
  uint32_t last_word;
  uint32_t shift0;
  uint32_t first_word;
  uint16_t window_row_limit;
  uint8_t *src_3;
  uint8_t code_value_3;
  uint8_t *heavy_row;
  uint heavy_col_j;
  uint heavy_row_i_3;
  uint8_t *src_2;
  bool nonzero;
  uint64_t ge_word;
  uint64_t *ge_row_1;
  uint64_t ge_mask2;
  uint ge_column_j;
  uint8_t *dest_2;
  uint ge_row_k;
  uint ge_above_i;
  uint16_t *pivot_row_1;
  uint ii_3;
  uint ii_2;
  uint ii_1;
  uint ii;
  uint8_t *src_1;
  uint8_t code_value_2;
  uint heavy_col_i_2;
  uint heavy_row_i_2;
  uint16_t ge_row_i;
  uint8_t *dest_1;
  uint8_t *dest;
  uint8_t code_value_1;
  uint heavy_col_i_1;
  uint heavy_row_i_1;
  uint16_t dest_row_i;
  uint dest_pivot_i;
  uint64_t *ge_row;
  uint8_t code_value;
  uint heavy_col_i;
  uint16_t heavy_row_i;
  uint16_t ge_row_i_1;
  uint8_t *src;
  uint src_pivot_i;
  uint64_t ge_mask_1;
  uint backsub_i;
  uint count;
  uint32_t jj;
  uint8_t *column_src;
  PeelColumn *column;
  uint8_t *win_table [128];
  uint32_t win_lim;
  uint next_check_i;
  uint w;
  uint first_heavy_column;
  uint16_t first_heavy_row;
  uint pivot_i;
  uint pivot_count;
  uint local_668;
  uint local_60c;
  ulong local_5e8;
  ushort local_5be;
  ushort local_59a;
  ushort *local_598;
  char *local_570;
  long in_stack_fffffffffffffaa0;
  int bytes;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  void *in_stack_fffffffffffffab0;
  void *in_stack_fffffffffffffab8;
  ulong local_540;
  uint local_534;
  uint local_524;
  ushort *local_520;
  uint local_518;
  uint local_514;
  uint local_510;
  uint local_50c;
  int in_stack_fffffffffffffb20;
  uint8_t in_stack_fffffffffffffb27;
  int in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb2c;
  undefined2 in_stack_fffffffffffffb30;
  ushort in_stack_fffffffffffffb32;
  uint in_stack_fffffffffffffb34;
  uint local_4a4;
  ulong local_4a0;
  uint local_490;
  uint local_48c;
  long local_488;
  long local_480;
  int in_stack_fffffffffffffb8c;
  void *in_stack_fffffffffffffb90;
  void *in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffd74;
  void *in_stack_fffffffffffffd78;
  uint8_t in_stack_fffffffffffffd87;
  void *in_stack_fffffffffffffd88;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_58;
  
  local_58 = ((uint)*(ushort *)((long)in_RDI + 0x8e) + (uint)(ushort)in_RDI[6]) - 1;
  uVar8 = *(short *)((long)in_RDI + 0x8e) + *(short *)((long)in_RDI + 10);
  uVar2 = in_RDI[0x3d];
  if (0x2c < local_58) {
    if (local_58 < 0x87) {
      if (local_58 < 0x46) {
        if (local_58 < 0x2d) {
          local_64 = 4;
          local_68 = 0x18;
        }
        else {
          local_64 = 5;
          local_68 = 0x2d;
        }
      }
      else {
        local_64 = 6;
        local_68 = 0x46;
      }
    }
    else {
      local_64 = 7;
      local_68 = 0x87;
    }
    local_6c = 1 << (sbyte)local_64;
    local_480 = *(long *)(in_RDI + 0x1a);
    local_488 = *(long *)(in_RDI + 8);
    local_48c = 1;
    for (local_490 = (uint)(ushort)in_RDI[1]; local_490 != 0; local_490 = local_490 - 1) {
      if (*(char *)(local_480 + 4) == '\x01') {
        *(long *)(&stack0xfffffffffffffb88 + (ulong)local_48c * 8) = local_488;
        local_48c = local_48c + 1;
        if (local_6c <= local_48c) break;
      }
      local_480 = local_480 + 6;
      local_488 = local_488 + (ulong)*in_RDI;
    }
    if (local_6c <= local_48c) {
LAB_0010c400:
      do {
        iVar4 = local_58 - local_64;
        uVar5 = iVar4 + 1;
        local_4a0 = 1L << ((byte)local_58 & 0x3f);
        for (local_4a4 = local_58; uVar5 < local_4a4; local_4a4 = local_4a4 - 1) {
          uVar1 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_4a4 * 2);
          if (((uVar8 <= uVar1) && (uVar2 <= local_4a4)) &&
             (*(char *)(*(long *)(in_RDI + 0x38) +
                       (ulong)(in_RDI[0x3a] * (uint)(ushort)(uVar1 - uVar8) + (local_4a4 - uVar2)))
              != '\x01')) {
            gf256_mul_mem((void *)CONCAT44(in_stack_fffffffffffffb34,
                                           CONCAT22(in_stack_fffffffffffffb32,
                                                    in_stack_fffffffffffffb30)),
                          (void *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                          in_stack_fffffffffffffb27,in_stack_fffffffffffffb20);
          }
          lVar3 = *(long *)(in_RDI + 0x26);
          for (in_stack_fffffffffffffb34 = uVar5; in_stack_fffffffffffffb34 < local_4a4;
              in_stack_fffffffffffffb34 = in_stack_fffffffffffffb34 + 1) {
            in_stack_fffffffffffffb32 =
                 *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)in_stack_fffffffffffffb34 * 2);
            if ((in_stack_fffffffffffffb32 < uVar8) || (local_4a4 < uVar2)) {
              if ((*(ulong *)(lVar3 + (ulong)(local_4a4 >> 6) * 8 +
                             (ulong)(in_RDI[0x2a] * (uint)in_stack_fffffffffffffb32) * 8) &
                  local_4a0) != 0) {
                gf256_add_mem(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                              in_stack_fffffffffffffb8c);
              }
            }
            else {
              in_stack_fffffffffffffb2c = (uint)in_stack_fffffffffffffb32 - (uint)uVar8;
              in_stack_fffffffffffffb28 = local_4a4 - uVar2;
              in_stack_fffffffffffffb27 =
                   *(uint8_t *)
                    (*(long *)(in_RDI + 0x38) +
                    (ulong)(in_RDI[0x3a] * in_stack_fffffffffffffb2c + in_stack_fffffffffffffb28));
              if (in_stack_fffffffffffffb27 != '\0') {
                gf256_muladd_mem(in_stack_fffffffffffffd88,in_stack_fffffffffffffd87,
                                 in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
              }
            }
          }
          local_4a0 = local_4a0 >> 1 | local_4a0 << 0x3f;
        }
        uVar1 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)uVar5 * 2);
        if (((uVar8 <= uVar1) && (uVar2 <= uVar5)) &&
           (*(char *)(*(long *)(in_RDI + 0x38) +
                     (ulong)(in_RDI[0x3a] * ((uint)uVar1 - (uint)uVar8) + (uVar5 - uVar2))) !=
            '\x01')) {
          gf256_mul_mem((void *)CONCAT44(in_stack_fffffffffffffb34,
                                         CONCAT22(in_stack_fffffffffffffb32,
                                                  in_stack_fffffffffffffb30)),
                        (void *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                        in_stack_fffffffffffffb27,in_stack_fffffffffffffb20);
        }
        in_stack_fffffffffffffb90 =
             (void *)(*(long *)(in_RDI + 8) +
                     (ulong)(*in_RDI *
                            (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)uVar5 * 2)));
        in_stack_fffffffffffffb98 =
             (void *)(*(long *)(in_RDI + 8) +
                     (ulong)(*in_RDI *
                            (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)(iVar4 + 2) * 2)));
        bytes = (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
        gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                         (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),bytes
                        );
        gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                         (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),bytes
                        );
        gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                         (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),bytes
                        );
        gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                         (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),bytes
                        );
        for (local_50c = 1; local_50c < 8; local_50c = local_50c + 1) {
          gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                           (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                           bytes);
        }
        if (4 < local_64) {
          for (local_510 = 1; local_510 < 0x10; local_510 = local_510 + 1) {
            gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                             (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
                             bytes);
          }
          if (5 < local_64) {
            for (local_514 = 1; local_514 < 0x20; local_514 = local_514 + 1) {
              gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                               (void *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8)
                               ,bytes);
            }
            if (6 < local_64) {
              in_stack_fffffffffffffd88 =
                   (void *)(*(long *)(in_RDI + 8) +
                           (ulong)(*in_RDI *
                                  (uint)*(ushort *)
                                         (*(long *)(in_RDI + 0x32) + (ulong)(iVar4 + 7) * 2)));
              for (local_518 = 1; local_518 < 0x40; local_518 = local_518 + 1) {
                gf256_addset_mem(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                                 (void *)CONCAT17(in_stack_fffffffffffffaaf,
                                                  in_stack_fffffffffffffaa8),bytes);
              }
            }
          }
        }
        if (uVar2 <= local_58) {
          local_520 = *(ushort **)(in_RDI + 0x2e);
          for (local_524 = 0; local_524 < uVar5; local_524 = local_524 + 1) {
            uVar9 = (uint)*local_520;
            if (uVar8 <= uVar9) {
              local_534 = uVar5;
              if (uVar5 < uVar2) {
                local_540 = 1L << ((byte)uVar5 & 0x3f);
                in_stack_fffffffffffffab8 =
                     (void *)(*(long *)(in_RDI + 0x26) + (ulong)(in_RDI[0x2a] * uVar9) * 8);
                for (; local_534 < uVar2 && local_534 <= local_58; local_534 = local_534 + 1) {
                  in_stack_fffffffffffffab0 =
                       *(void **)((long)in_stack_fffffffffffffab8 + (ulong)(local_534 >> 6) * 8);
                  in_stack_fffffffffffffaaf = ((ulong)in_stack_fffffffffffffab0 & local_540) != 0;
                  if ((bool)in_stack_fffffffffffffaaf) {
                    in_stack_fffffffffffffaa0 =
                         *(long *)(in_RDI + 8) +
                         (ulong)(*in_RDI *
                                (uint)*(ushort *)(*(long *)(in_RDI + 0x32) + (ulong)local_534 * 2));
                    gf256_add_mem(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                                  in_stack_fffffffffffffb8c);
                  }
                  local_540 = local_540 << 1 | local_540 >> 0x3f;
                }
              }
              local_570 = (char *)(*(long *)(in_RDI + 0x38) +
                                  (ulong)(in_RDI[0x3a] * (uVar9 - uVar8) + (local_534 - uVar2)));
              for (; local_534 <= local_58; local_534 = local_534 + 1) {
                if (*local_570 != '\0') {
                  gf256_muladd_mem(in_stack_fffffffffffffd88,in_stack_fffffffffffffd87,
                                   in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
                }
                local_570 = local_570 + 1;
              }
            }
            local_520 = local_520 + 1;
          }
        }
        if (local_58 < uVar2) {
          local_668 = 0x7fff;
        }
        else {
          local_668 = (uint)uVar8;
        }
        uVar9 = uVar5 >> 6;
        bVar7 = (byte)uVar5 & 0x3f;
        local_598 = *(ushort **)(in_RDI + 0x2e);
        if (uVar9 == local_58 >> 6) {
          for (local_59a = 0; local_59a < uVar5; local_59a = local_59a + 1) {
            if ((*local_598 < local_668) &&
               (((uint)(*(ulong *)(*(long *)(in_RDI + 0x26) + (ulong)uVar9 * 8 +
                                  (ulong)(in_RDI[0x2a] * (uint)*local_598) * 8) >> bVar7) &
                local_6c - 1) != 0)) {
              gf256_add_mem(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb8c);
            }
            local_598 = local_598 + 1;
          }
        }
        else {
          for (local_5be = 0; local_5be < uVar5; local_5be = local_5be + 1) {
            if ((*local_598 < local_668) &&
               (puVar6 = (ulong *)(*(long *)(in_RDI + 0x26) + (ulong)uVar9 * 8 +
                                  (ulong)(in_RDI[0x2a] * (uint)*local_598) * 8),
               (((uint)(*puVar6 >> bVar7) | (uint)(puVar6[1] << (0x40 - bVar7 & 0x3f))) &
               local_6c - 1) != 0)) {
              gf256_add_mem(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                            in_stack_fffffffffffffb8c);
            }
            local_598 = local_598 + 1;
          }
        }
        local_58 = local_58 - local_64;
      } while (local_68 <= local_58);
      if (local_58 < 0x46) {
        if (local_58 < 0x2d) {
          if (local_58 < 0x18) goto LAB_0010d477;
          local_64 = 4;
          local_68 = 0x18;
        }
        else {
          local_64 = 5;
          local_68 = 0x2d;
        }
      }
      else {
        local_64 = 6;
        local_68 = 0x46;
      }
      local_6c = 1 << (sbyte)local_64;
      goto LAB_0010c400;
    }
  }
LAB_0010d477:
  local_5e8 = 1L << ((byte)local_58 & 0x3f);
  while( true ) {
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_58 * 2);
    if (((uVar8 <= uVar1) && (uVar2 <= local_58)) &&
       (*(char *)(*(long *)(in_RDI + 0x38) +
                 (ulong)(in_RDI[0x3a] * ((uint)uVar1 - (uint)uVar8) + (local_58 - uVar2))) != '\x01'
       )) {
      gf256_mul_mem((void *)CONCAT44(in_stack_fffffffffffffb34,
                                     CONCAT22(in_stack_fffffffffffffb32,in_stack_fffffffffffffb30)),
                    (void *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                    in_stack_fffffffffffffb27,in_stack_fffffffffffffb20);
    }
    lVar3 = *(long *)(in_RDI + 0x26);
    for (local_60c = 0; local_60c < local_58; local_60c = local_60c + 1) {
      uVar1 = *(ushort *)(*(long *)(in_RDI + 0x2e) + (ulong)local_60c * 2);
      if ((uVar1 < uVar8) || (local_60c < uVar2)) {
        if ((*(ulong *)(lVar3 + (ulong)(local_58 >> 6) * 8 + (ulong)(in_RDI[0x2a] * (uint)uVar1) * 8
                       ) & local_5e8) != 0) {
          gf256_add_mem(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                        in_stack_fffffffffffffb8c);
        }
      }
      else if (*(char *)(*(long *)(in_RDI + 0x38) +
                        (ulong)(in_RDI[0x3a] * ((uint)uVar1 - (uint)uVar8) + (local_58 - uVar2))) !=
               '\0') {
        gf256_muladd_mem(in_stack_fffffffffffffd88,in_stack_fffffffffffffd87,
                         in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
      }
    }
    if (local_58 == 0) break;
    local_58 = local_58 - 1;
    local_5e8 = local_5e8 >> 1 | local_5e8 << 0x3f;
  }
  return;
}

Assistant:

void Codec::BackSubstituteAboveDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- BackSubstituteAboveDiagonal ----" << endl << endl;)

    CAT_IF_ROWOP(unsigned rowops = 0; unsigned heavyops = 0;)

    const unsigned pivot_count = _defer_count + _mix_count;
    unsigned pivot_i = pivot_count - 1;
    const uint16_t first_heavy_row = _defer_count + _dense_count;
    const unsigned first_heavy_column = _first_heavy_column;

#if defined(CAT_WINDOWED_BACKSUB)
    // Build temporary storage space if windowing is to be used
    if (pivot_i >= CAT_ABOVE_WIN_THRESH_5)
    {
        // Calculate initial window size
        unsigned w, next_check_i;
        if (pivot_i >= CAT_ABOVE_WIN_THRESH_7) {
            w = 7;
            next_check_i = CAT_ABOVE_WIN_THRESH_7;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
            w = 6;
            next_check_i = CAT_ABOVE_WIN_THRESH_6;
        }
        else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
            w = 5;
            next_check_i = CAT_ABOVE_WIN_THRESH_5;
        }
        else {
            w = 4;
            next_check_i = CAT_ABOVE_WIN_THRESH_4;
        }
        uint32_t win_lim = 1 << w;

        CAT_IF_DUMP(cout << "Activating windowed back-substitution with initial window " << w << endl;)

        // Use the first few peel column values as window table space
        // NOTE: The peeled column values were previously used up until this point,
        // but now they are unused, and so they can be reused for temporary space.
        uint8_t * GF256_RESTRICT win_table[128];
        const PeelColumn * GF256_RESTRICT column = _peel_cols;
        uint8_t * GF256_RESTRICT column_src = _recovery_blocks;
        uint32_t jj = 1;

        // For each original data column:
        for (unsigned count = _block_count; count > 0; --count, ++column, column_src += _block_bytes)
        {
            // If column is peeled:
            if (column->Mark == MARK_PEEL)
            {
                // Reuse the block value temporarily as window table space
                win_table[jj] = column_src;

                CAT_IF_DUMP(cout << "-- Window table entry " << jj << " set to column " << _block_count - count << endl;)

                // If done:
                if (++jj >= win_lim) {
                    break;
                }
            }
        }

        CAT_IF_DUMP(if (jj < win_lim) {
            cout << "!! Not enough space in peeled columns to generate a table.  " \
                "Going back to normal back-substitute." << endl;
        })

        // If enough space was found:
        if (jj >= win_lim) for (;;)
        {
            // Calculate first column in window
            const unsigned backsub_i = pivot_i - w + 1;

            CAT_IF_DUMP(cout << "-- Windowing from " << backsub_i << " to " << pivot_i << " (inclusive)" << endl;)

            // Eliminate upper triangular part above windowed bits:

            // For each column:
            uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);
            for (unsigned src_pivot_i = pivot_i; src_pivot_i > backsub_i; --src_pivot_i)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[src_pivot_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[src_pivot_i];

                const uint16_t ge_row_i = _pivots[src_pivot_i];

                // If diagonal element is heavy:
                if (ge_row_i >= first_heavy_row &&
                    src_pivot_i >= first_heavy_column)
                {
                    // Look up row value
                    CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                    uint16_t heavy_row_i = ge_row_i - first_heavy_row;
                    CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                    unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
                    const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                    // Normalize code value, setting it to 1 (implicitly nonzero)
                    if (code_value != 1) {
                        gf256_div_mem(src, src, code_value, _block_bytes);
                        CAT_IF_ROWOP(++heavyops;)
                    }

                    CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
                }

                CAT_IF_DUMP(cout << "Back-substituting small triangle from pivot " << src_pivot_i << "[" << (unsigned)src[0] << "] :";)

                uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (src_pivot_i >> 6);

                // For each row above the diagonal:
                for (unsigned dest_pivot_i = backsub_i; dest_pivot_i < src_pivot_i; ++dest_pivot_i)
                {
                    const uint16_t dest_row_i = _pivots[dest_pivot_i];

                    // If row is heavy:
                    if (dest_row_i >= first_heavy_row && src_pivot_i >= first_heavy_column)
                    {
                        CAT_DEBUG_ASSERT(dest_row_i >= first_heavy_row);
                        const unsigned heavy_row_i = dest_row_i - first_heavy_row;
                        CAT_DEBUG_ASSERT(src_pivot_i >= first_heavy_column);
                        const unsigned heavy_col_i = src_pivot_i - first_heavy_column;
                        const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                        // If column is zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                        CAT_IF_DUMP(cout << " h" << dest_pivot_i;)
                    }
                    else
                    {
                        // If bit is set in that row:
                        if (ge_row[_ge_pitch * dest_row_i] & ge_mask)
                        {
                            CAT_DEBUG_ASSERT(_ge_col_map[dest_pivot_i] < _recovery_rows);
                            uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[dest_pivot_i];

                            // Back-substitute
                            gf256_add_mem(dest, src, _block_bytes);

                            CAT_IF_ROWOP(++rowops;)
                            CAT_IF_DUMP(cout << " " << dest_pivot_i;)
                        }
                    }
                } // next pivot above

                ge_mask = CAT_ROR64(ge_mask, 1);

                CAT_IF_DUMP(cout << endl;)
            } // next pivot

            // Normalize the final diagonal element
            const uint16_t ge_row_i = _pivots[backsub_i];

            // If this is a heavy row and column:
            if (ge_row_i >= first_heavy_row &&
                backsub_i >= first_heavy_column)
            {
                CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
                CAT_DEBUG_ASSERT(backsub_i >= first_heavy_column);
                const unsigned heavy_row_i = ge_row_i - first_heavy_row;
                const unsigned heavy_col_i = backsub_i - first_heavy_column;
                CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
                CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                // Look up row value
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // Divide by this code value (implicitly nonzero)
                if (code_value != 1)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];

                    gf256_div_mem(src, src, code_value, _block_bytes);
                    CAT_IF_ROWOP(++heavyops;)
                }
            }

            CAT_IF_DUMP(cout << "-- Generating window table with " << w << " bits" << endl;)

            // Generate window table: 2 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i] < _recovery_rows);
            win_table[1] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i];
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 1] < _recovery_rows);
            win_table[2] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 1];
            gf256_addset_mem(win_table[3], win_table[1], win_table[2], _block_bytes);
            CAT_IF_ROWOP(++rowops;)

            // Generate window table: 3 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 2] < _recovery_rows);
            win_table[4] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 2];
            gf256_addset_mem(win_table[5], win_table[1], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[6], win_table[2], win_table[4], _block_bytes);
            gf256_addset_mem(win_table[7], win_table[1], win_table[6], _block_bytes);
            CAT_IF_ROWOP(rowops += 3;)

            // Generate window table: 4 bits
            CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 3] < _recovery_rows);
            win_table[8] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 3];
            for (unsigned ii = 1; ii < 8; ++ii) {
                gf256_addset_mem(win_table[8 + ii], win_table[ii], win_table[8], _block_bytes);
            }
            CAT_IF_ROWOP(rowops += 7;)

            // Generate window table: 5+ bits
            if (w >= 5)
            {
                CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 4] < _recovery_rows);
                win_table[16] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 4];
                for (unsigned ii = 1; ii < 16; ++ii) {
                    gf256_addset_mem(win_table[16 + ii], win_table[ii], win_table[16], _block_bytes);
                }
                CAT_IF_ROWOP(rowops += 15;)

                if (w >= 6)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 5] < _recovery_rows);
                    win_table[32] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 5];
                    for (unsigned ii = 1; ii < 32; ++ii) {
                        gf256_addset_mem(win_table[32 + ii], win_table[ii], win_table[32], _block_bytes);
                    }
                    CAT_IF_ROWOP(rowops += 31;)

                    if (w >= 7)
                    {
                        CAT_DEBUG_ASSERT(_ge_col_map[backsub_i + 6] < _recovery_rows);
                        win_table[64] = _recovery_blocks + _block_bytes * _ge_col_map[backsub_i + 6];
                        for (unsigned ii = 1; ii < 64; ++ii) {
                            gf256_addset_mem(win_table[64 + ii], win_table[ii], win_table[64], _block_bytes);
                        }
                        CAT_IF_ROWOP(rowops += 63;)
                    }
                }
            }

            // If a row above the window may be heavy:
            if (pivot_i >= first_heavy_column)
            {
                const uint16_t * GF256_RESTRICT pivot_row = _pivots;

                // For each pivot in the window:
                for (unsigned ge_above_i = 0; ge_above_i < backsub_i; ++ge_above_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If row is not heavy:
                    if (ge_row_k < first_heavy_row) {
                        continue; // Skip it
                    }

                    CAT_DEBUG_ASSERT(_ge_col_map[ge_above_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_above_i];
                    unsigned ge_column_j = backsub_i;

                    // If the first column of window is not heavy:
                    if (ge_column_j < first_heavy_column)
                    {
                        uint64_t ge_mask2 = (uint64_t)1 << (ge_column_j & 63);
                        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + _ge_pitch * ge_row_k;

                        // For each non-heavy column in the extra row:
                        for (; ge_column_j < first_heavy_column && ge_column_j <= pivot_i; ++ge_column_j)
                        {
                            const uint64_t ge_word = ge_row[ge_column_j >> 6];
                            const bool nonzero = 0 != (ge_word & ge_mask2);

                            // If column is non-zero:
                            if (nonzero)
                            {
                                CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                                const uint8_t *src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                                gf256_add_mem(dest, src, _block_bytes);

                                CAT_IF_ROWOP(++rowops;)
                            }

                            ge_mask2 = CAT_ROL64(ge_mask2, 1);
                        }
                    }

                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    CAT_DEBUG_ASSERT(ge_column_j >= first_heavy_column);
                    const unsigned heavy_row_i = ge_row_k - first_heavy_row;
                    const unsigned heavy_col_j = ge_column_j - first_heavy_column;
                    CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                    CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);

                    const uint8_t * GF256_RESTRICT heavy_row = &_heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_j];

                    // For each heavy column:
                    for (; ge_column_j <= pivot_i; ++ge_column_j)
                    {
                        const uint8_t code_value = *heavy_row++;

                        // If zero:
                        if (0 == code_value) {
                            continue; // Skip it
                        }

                        CAT_DEBUG_ASSERT(_ge_col_map[ge_column_j] < _recovery_rows);
                        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[ge_column_j];

                        // Back-substitute
                        gf256_muladd_mem(dest, code_value, src, _block_bytes);

                        CAT_IF_ROWOP(if (code_value == 1) ++rowops; else ++heavyops;)
                    } // next column in row
                } // next pivot in window
            } // end if contains heavy

            // Only add window table entries for rows under this limit
            const uint16_t window_row_limit = (pivot_i >= first_heavy_column) ? first_heavy_row : 0x7fff;

            const uint32_t first_word = backsub_i >> 6;
            const uint32_t shift0 = backsub_i & 63;
            const uint32_t last_word = pivot_i >> 6;
            const uint16_t * GF256_RESTRICT pivot_row = _pivots;

            // If not straddling words:
            if (first_word == last_word)
            {
                // For each pivot row:
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const uint32_t win_bits = (uint32_t)(ge_row[0] >> shift0) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }
            else // Rare: Straddling case
            {
                const unsigned shift1 = 64 - shift0;

                // For each pivot row,
                for (uint16_t above_pivot_i = 0; above_pivot_i < backsub_i; ++above_pivot_i)
                {
                    const unsigned ge_row_k = *pivot_row++;

                    // If pivot row is heavy:
                    if (ge_row_k >= window_row_limit) {
                        continue; // Skip it
                    }

                    // Calculate window bits
                    const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + first_word + _ge_pitch * ge_row_k;
                    const unsigned win_bits = ( (uint32_t)(ge_row[0] >> shift0) | (uint32_t)(ge_row[1] << shift1) ) & (win_lim - 1);

                    // If any XOR needs to be performed:
                    if (win_bits != 0)
                    {
                        CAT_IF_DUMP(cout << "Adding window table " << win_bits << " to pivot " << above_pivot_i << endl;)

                        CAT_DEBUG_ASSERT(_ge_col_map[above_pivot_i] < _recovery_rows);
                        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[above_pivot_i];

                        // Back-substitute
                        gf256_add_mem(dest, win_table[win_bits], _block_bytes);

                        CAT_IF_ROWOP(++rowops;)
                    }
                }
            }

            // If column index falls below window size:
            pivot_i -= w;
            if (pivot_i < next_check_i)
            {
                if (pivot_i >= CAT_ABOVE_WIN_THRESH_6) {
                    w = 6;
                    next_check_i = CAT_ABOVE_WIN_THRESH_6;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_5) {
                    w = 5;
                    next_check_i = CAT_ABOVE_WIN_THRESH_5;
                }
                else if (pivot_i >= CAT_ABOVE_WIN_THRESH_4) {
                    w = 4;
                    next_check_i = CAT_ABOVE_WIN_THRESH_4;
                }
                else {
                    break;
                }

                // Update window limit
                win_lim = 1 << w;
            }
        } // next window
    } // end if windowed
#endif // CAT_WINDOWED_BACKSUB

    uint64_t ge_mask = (uint64_t)1 << (pivot_i & 63);

    // For each remaining pivot:
    for (;;)
    {
        // Calculate source
        CAT_DEBUG_ASSERT(_ge_col_map[pivot_i] < _recovery_rows);
        uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * _ge_col_map[pivot_i];

        const uint16_t ge_row_i = _pivots[pivot_i];

        // If diagonal element is heavy:
        if (ge_row_i >= first_heavy_row &&
            pivot_i >= first_heavy_column)
        {
            // Look up row value
            CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
            const unsigned heavy_row_i = ge_row_i - first_heavy_row;
            CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
            const unsigned heavy_col_i = pivot_i - first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_i < _heavy_columns);
            CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
            const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

            // Normalize code value, setting it to 1 (implicitly nonzero)
            if (code_value != 1) {
                gf256_div_mem(src, src, code_value, _block_bytes);
                CAT_IF_ROWOP(++heavyops;)
            }

            CAT_IF_DUMP(cout << "Normalized diagonal for heavy pivot " << pivot_i << endl;)
        }

        CAT_IF_DUMP(cout << "Pivot " << pivot_i << "[" << (unsigned)src[0] << "]:";)

        const uint64_t * GF256_RESTRICT ge_row = _ge_matrix + (pivot_i >> 6);

        // For each pivot row above it:
        for (unsigned ge_up_i = 0; ge_up_i < pivot_i; ++ge_up_i)
        {
            const uint16_t up_row_i = _pivots[ge_up_i];

            // If element is heavy:
            if (up_row_i >= first_heavy_row &&
                ge_up_i >= first_heavy_column)
            {
                const unsigned heavy_row_i = up_row_i - first_heavy_row;
                const unsigned heavy_col_i = pivot_i - first_heavy_column;
                const uint8_t code_value = _heavy_matrix[_heavy_pitch * heavy_row_i + heavy_col_i];

                // If column is zero:
                if (!code_value) {
                    continue; // Skip it
                }

                CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                // Back-substitute
                gf256_muladd_mem(dest, code_value, src, _block_bytes);

                CAT_IF_ROWOP(if (code_value == 1) {
                    ++rowops;
                }
                else {
                    ++heavyops;
                })
                CAT_IF_DUMP(cout << " h" << up_row_i;)
            }
            else
            {
                // If bit is set in that row,
                if (ge_row[_ge_pitch * up_row_i] & ge_mask)
                {
                    CAT_DEBUG_ASSERT(_ge_col_map[ge_up_i] < _recovery_rows);
                    uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * _ge_col_map[ge_up_i];

                    // Back-substitute
                    gf256_add_mem(dest, src, _block_bytes);

                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << " " << up_row_i;)
                }
            }
        } // next pivot above

        if (pivot_i <= 0) {
            break;
        }
        --pivot_i;

        ge_mask = CAT_ROR64(ge_mask, 1);

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "BackSubstituteAboveDiagonal used " << rowops << " row ops = " << rowops / (double)_block_count << "*N and " << heavyops << " heavy ops" << endl;)
}